

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atomprops.c
# Opt level: O0

int identifyAtom(char *name,char *resname,int Verbose)

{
  char cVar1;
  int iVar2;
  char *__s;
  size_t sVar3;
  bool bVar4;
  int local_3c;
  int j;
  char *atstr;
  char warnresn [5];
  char warnstr [5];
  int emitWarning;
  int n;
  int Verbose_local;
  char *resname_local;
  char *name_local;
  
  warnstr[1] = -1;
  warnstr[2] = -1;
  warnstr[3] = -1;
  warnstr[4] = -1;
  stack0xffffffffffffffdc = 0;
  switch(*name) {
  case ' ':
  case '\"':
  case '\'':
  case '*':
  case '+':
  case '-':
  case '0':
  case '1':
  case '2':
  case '3':
  case '4':
  case '5':
  case '6':
  case '7':
  case '8':
  case '9':
  case '_':
  case '`':
    switch(name[1]) {
    case 'A':
      if (name[3] == '1') {
        warnstr[1] = '\t';
        warnstr[2] = '\0';
        warnstr[3] = '\0';
        warnstr[4] = '\0';
        stack0xffffffffffffffdc = 1;
      }
      else if (name[3] == '2') {
        warnstr[1] = '\b';
        warnstr[2] = '\0';
        warnstr[3] = '\0';
        warnstr[4] = '\0';
        stack0xffffffffffffffdc = 1;
      }
      break;
    case 'B':
      warnstr[1] = '\x15';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      break;
    case 'C':
      warnstr[1] = '\x06';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      break;
    case 'D':
      warnstr[1] = '\x02';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      break;
    case 'F':
      warnstr[1] = '\n';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      break;
    case 'H':
      switch(name[2]) {
      case 'E':
        iVar2 = fixAtomName(name,resname,2);
        warnstr[1] = '\x02';
        warnstr[2] = '\0';
        warnstr[3] = '\0';
        warnstr[4] = '\0';
        if (iVar2 != 0) {
          warnstr[1] = '/';
          warnstr[2] = '\0';
          warnstr[3] = '\0';
          warnstr[4] = '\0';
        }
        break;
      case 'F':
        iVar2 = fixAtomName(name,resname,2);
        warnstr[1] = '\x02';
        warnstr[2] = '\0';
        warnstr[3] = '\0';
        warnstr[4] = '\0';
        if (iVar2 != 0) {
          warnstr[1] = '0';
          warnstr[2] = '\0';
          warnstr[3] = '\0';
          warnstr[4] = '\0';
        }
        break;
      case 'G':
        iVar2 = fixAtomName(name,resname,2);
        warnstr[1] = '\x02';
        warnstr[2] = '\0';
        warnstr[3] = '\0';
        warnstr[4] = '\0';
        if (iVar2 != 0) {
          warnstr[1] = '1';
          warnstr[2] = '\0';
          warnstr[3] = '\0';
          warnstr[4] = '\0';
        }
        break;
      default:
        warnstr[1] = '\x02';
        warnstr[2] = '\0';
        warnstr[3] = '\0';
        warnstr[4] = '\0';
        break;
      case 'O':
        iVar2 = fixAtomName(name,resname,2);
        warnstr[1] = '\x02';
        warnstr[2] = '\0';
        warnstr[3] = '\0';
        warnstr[4] = '\0';
        if (iVar2 != 0) {
          warnstr[1] = '2';
          warnstr[2] = '\0';
          warnstr[3] = '\0';
          warnstr[4] = '\0';
        }
      }
      break;
    case 'I':
      warnstr[1] = '3';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      break;
    case 'K':
      warnstr[1] = '6';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      break;
    case 'N':
      warnstr[1] = '\b';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      break;
    case 'O':
      warnstr[1] = '\t';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      break;
    case 'P':
      warnstr[1] = '\f';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      break;
    case 'S':
      if ((*name == ' ') && (name[2] == 'E')) {
        warnstr[1] = 'W';
        warnstr[2] = '\0';
        warnstr[3] = '\0';
        warnstr[4] = '\0';
        stack0xffffffffffffffdc = 1;
      }
      else {
        warnstr[1] = '\v';
        warnstr[2] = '\0';
        warnstr[3] = '\0';
        warnstr[4] = '\0';
      }
      break;
    case 'U':
      warnstr[1] = 'd';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      break;
    case 'V':
      warnstr[1] = 'e';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      break;
    case 'W':
      warnstr[1] = 'f';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      break;
    case 'Y':
      warnstr[1] = 'h';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
    }
    break;
  default:
    break;
  case 'A':
    switch(name[1]) {
    case 'C':
      warnstr[1] = '\x06';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      stack0xffffffffffffffdc = 1;
      break;
    case 'G':
      warnstr[1] = '\x0e';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      break;
    case 'H':
      warnstr[1] = '\x02';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      stack0xffffffffffffffdc = 1;
      break;
    case 'L':
      warnstr[1] = '\x0f';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      break;
    case 'M':
      warnstr[1] = '\x10';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      break;
    case 'N':
      warnstr[1] = '\b';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      stack0xffffffffffffffdc = 1;
      break;
    case 'O':
      warnstr[1] = '\t';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      stack0xffffffffffffffdc = 1;
      break;
    case 'P':
      warnstr[1] = '\f';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      stack0xffffffffffffffdc = 1;
      break;
    case 'R':
      warnstr[1] = '\x11';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      break;
    case 'S':
      warnstr[1] = '\x12';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      break;
    case 'T':
      warnstr[1] = '\x13';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      break;
    case 'U':
      warnstr[1] = '\x14';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
    }
    break;
  case 'B':
    switch(name[1]) {
    case 'A':
      warnstr[1] = '\x16';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      break;
    case 'E':
      warnstr[1] = '\x17';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      break;
    case 'I':
      warnstr[1] = '\x18';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      break;
    case 'K':
      warnstr[1] = '\x19';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      break;
    case 'R':
      warnstr[1] = '\x1a';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
    }
    break;
  case 'C':
    switch(name[1]) {
    case 'A':
      warnstr[1] = '\x1b';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      break;
    default:
      warnstr[1] = '\x06';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      stack0xffffffffffffffdc = 1;
      break;
    case 'C':
      warnstr[1] = '\x06';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      stack0xffffffffffffffdc = 1;
      break;
    case 'D':
      warnstr[1] = '\x1c';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      break;
    case 'E':
      warnstr[1] = '\x1d';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      break;
    case 'F':
      warnstr[1] = '\x1e';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      break;
    case 'H':
      warnstr[1] = '\x02';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      stack0xffffffffffffffdc = 1;
      break;
    case 'L':
      warnstr[1] = '\x1f';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      break;
    case 'M':
      warnstr[1] = ' ';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      break;
    case 'N':
      warnstr[1] = '\b';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      stack0xffffffffffffffdc = 1;
      break;
    case 'O':
      warnstr[1] = '!';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      stack0xffffffffffffffdc = 1;
      break;
    case 'P':
      warnstr[1] = '\f';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      stack0xffffffffffffffdc = 1;
      break;
    case 'R':
      warnstr[1] = '\"';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      break;
    case 'S':
      warnstr[1] = '#';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      break;
    case 'U':
      warnstr[1] = '$';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
    }
    break;
  case 'D':
    switch(name[1]) {
    case 'C':
      warnstr[1] = '\x06';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      stack0xffffffffffffffdc = 1;
      break;
    default:
      warnstr[1] = '\x02';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      stack0xffffffffffffffdc = 1;
      break;
    case 'H':
      warnstr[1] = '\x02';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      stack0xffffffffffffffdc = 1;
      break;
    case 'N':
      warnstr[1] = '\b';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      stack0xffffffffffffffdc = 1;
      break;
    case 'O':
      warnstr[1] = '\t';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      stack0xffffffffffffffdc = 1;
      break;
    case 'P':
      warnstr[1] = '\f';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      stack0xffffffffffffffdc = 1;
      break;
    case 'Y':
      warnstr[1] = '%';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
    }
    break;
  case 'E':
    switch(name[1]) {
    case 'C':
      warnstr[1] = '\x06';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      stack0xffffffffffffffdc = 1;
      break;
    case 'H':
      warnstr[1] = '\x02';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      stack0xffffffffffffffdc = 1;
      break;
    case 'N':
      warnstr[1] = '\b';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      stack0xffffffffffffffdc = 1;
      break;
    case 'O':
      warnstr[1] = '\t';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      stack0xffffffffffffffdc = 1;
      break;
    case 'P':
      warnstr[1] = '\f';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      stack0xffffffffffffffdc = 1;
      break;
    case 'R':
      warnstr[1] = '&';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      break;
    case 'S':
      warnstr[1] = '\'';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      break;
    case 'U':
      warnstr[1] = '(';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
    }
    break;
  case 'F':
    switch(name[1]) {
    case 'C':
      warnstr[1] = '\x06';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      stack0xffffffffffffffdc = 1;
      break;
    case 'E':
      warnstr[1] = ')';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      break;
    case 'H':
      warnstr[1] = '\x02';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      stack0xffffffffffffffdc = 1;
      break;
    case 'M':
      warnstr[1] = '*';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      break;
    case 'N':
      warnstr[1] = '\b';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      stack0xffffffffffffffdc = 1;
      break;
    case 'O':
      warnstr[1] = '\t';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      stack0xffffffffffffffdc = 1;
      break;
    case 'P':
      warnstr[1] = '\f';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      stack0xffffffffffffffdc = 1;
      break;
    case 'R':
      warnstr[1] = '+';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
    }
    break;
  case 'G':
    switch(name[1]) {
    case 'A':
      warnstr[1] = ',';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      break;
    case 'C':
      warnstr[1] = '\x06';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      stack0xffffffffffffffdc = 1;
      break;
    case 'D':
      warnstr[1] = '-';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      break;
    case 'E':
      warnstr[1] = '.';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      break;
    case 'H':
      warnstr[1] = '\x02';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      stack0xffffffffffffffdc = 1;
      break;
    case 'N':
      warnstr[1] = '\b';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      stack0xffffffffffffffdc = 1;
      break;
    case 'O':
      warnstr[1] = '\t';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      stack0xffffffffffffffdc = 1;
      break;
    case 'P':
      warnstr[1] = '\f';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      stack0xffffffffffffffdc = 1;
    }
    break;
  case 'H':
    switch(name[1]) {
    case 'E':
      iVar2 = fixAtomName(name,resname,1);
      warnstr[1] = '\x02';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      if (iVar2 != 0) {
        warnstr[1] = '/';
        warnstr[2] = '\0';
        warnstr[3] = '\0';
        warnstr[4] = '\0';
      }
      break;
    case 'F':
      iVar2 = fixAtomName(name,resname,1);
      warnstr[1] = '\x02';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      if (iVar2 != 0) {
        warnstr[1] = '0';
        warnstr[2] = '\0';
        warnstr[3] = '\0';
        warnstr[4] = '\0';
      }
      break;
    case 'G':
      iVar2 = fixAtomName(name,resname,1);
      warnstr[1] = '\x02';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      if (iVar2 != 0) {
        warnstr[1] = '1';
        warnstr[2] = '\0';
        warnstr[3] = '\0';
        warnstr[4] = '\0';
      }
      break;
    default:
      warnstr[1] = '\x02';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      break;
    case 'O':
      iVar2 = fixAtomName(name,resname,1);
      warnstr[1] = '\x02';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      if (iVar2 != 0) {
        warnstr[1] = '2';
        warnstr[2] = '\0';
        warnstr[3] = '\0';
        warnstr[4] = '\0';
      }
    }
    break;
  case 'I':
    if (name[1] == 'N') {
      warnstr[1] = '4';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
    }
    else if (name[1] == 'R') {
      warnstr[1] = '5';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
    }
    break;
  case 'K':
    if (name[1] == 'R') {
      warnstr[1] = '7';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
    }
    break;
  case 'L':
    cVar1 = name[1];
    if (cVar1 == 'A') {
      warnstr[1] = '8';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
    }
    else if (cVar1 == 'I') {
      warnstr[1] = '9';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
    }
    else if (cVar1 == 'U') {
      warnstr[1] = ':';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
    }
    break;
  case 'M':
    switch(name[1]) {
    case 'D':
      warnstr[1] = ';';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      break;
    case 'G':
      warnstr[1] = '<';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      break;
    case 'N':
      warnstr[1] = '=';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      break;
    case 'O':
      warnstr[1] = '>';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
    }
    break;
  case 'N':
    switch(name[1]) {
    case 'A':
      warnstr[1] = '?';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      stack0xffffffffffffffdc = 1;
      break;
    case 'B':
      warnstr[1] = '@';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      stack0xffffffffffffffdc = 1;
      break;
    case 'C':
      warnstr[1] = '\x06';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      stack0xffffffffffffffdc = 1;
      break;
    case 'D':
      warnstr[1] = 'A';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      stack0xffffffffffffffdc = 1;
      break;
    case 'E':
      warnstr[1] = 'B';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      stack0xffffffffffffffdc = 1;
      break;
    default:
      warnstr[1] = '\b';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      stack0xffffffffffffffdc = 1;
      break;
    case 'H':
      warnstr[1] = '\x02';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      stack0xffffffffffffffdc = 1;
      break;
    case 'I':
      warnstr[1] = 'C';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      break;
    case 'N':
      warnstr[1] = '\b';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      stack0xffffffffffffffdc = 1;
      break;
    case 'O':
      warnstr[1] = '\t';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      stack0xffffffffffffffdc = 1;
      break;
    case 'P':
      warnstr[1] = '\f';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      stack0xffffffffffffffdc = 1;
      break;
    case 'S':
      warnstr[1] = '\v';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      stack0xffffffffffffffdc = 1;
    }
    break;
  case 'O':
    if (name[1] != 'S') {
      warnstr[1] = '\t';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      stack0xffffffffffffffdc = 1;
    }
    else {
      warnstr[1] = 'F';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
    }
    stack0xffffffffffffffdc = (uint)(name[1] != 'S');
    break;
  case 'P':
    switch(name[1]) {
    case 'A':
      warnstr[1] = 'G';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      stack0xffffffffffffffdc = 1;
      break;
    case 'B':
      warnstr[1] = 'H';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      stack0xffffffffffffffdc = 1;
      break;
    default:
      warnstr[1] = '\f';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      stack0xffffffffffffffdc = 1;
      break;
    case 'D':
      warnstr[1] = 'I';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      stack0xffffffffffffffdc = 1;
      break;
    case 'M':
      warnstr[1] = 'J';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      break;
    case 'O':
      warnstr[1] = 'K';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      break;
    case 'R':
      warnstr[1] = 'L';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      break;
    case 'T':
      warnstr[1] = 'M';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      break;
    case 'U':
      warnstr[1] = 'N';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
    }
    break;
  case 'R':
    switch(name[1]) {
    case 'A':
      warnstr[1] = 'O';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      break;
    case 'B':
      warnstr[1] = 'P';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      break;
    case 'E':
      warnstr[1] = 'Q';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      break;
    case 'H':
      warnstr[1] = 'R';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      break;
    case 'N':
      warnstr[1] = 'S';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      break;
    case 'U':
      warnstr[1] = 'T';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
    }
    break;
  case 'S':
    switch(name[1]) {
    case 'B':
      warnstr[1] = 'U';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      stack0xffffffffffffffdc = 1;
      break;
    case 'C':
      warnstr[1] = 'V';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      break;
    default:
      warnstr[1] = '\v';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      stack0xffffffffffffffdc = 1;
      break;
    case 'E':
      warnstr[1] = 'W';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      stack0xffffffffffffffdc = 1;
      break;
    case 'I':
      warnstr[1] = 'X';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      break;
    case 'M':
      warnstr[1] = 'Y';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      break;
    case 'N':
      warnstr[1] = 'Z';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      break;
    case 'R':
      warnstr[1] = '[';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
    }
    break;
  case 'T':
    switch(name[1]) {
    case 'A':
      warnstr[1] = '\\';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      break;
    case 'B':
      warnstr[1] = ']';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      break;
    case 'C':
      warnstr[1] = '^';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      break;
    case 'E':
      warnstr[1] = '_';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      break;
    case 'H':
      warnstr[1] = '`';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      break;
    case 'I':
      warnstr[1] = 'a';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      break;
    case 'L':
      warnstr[1] = 'b';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      break;
    case 'M':
      warnstr[1] = 'c';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
    }
    break;
  case 'X':
    if (name[1] == 'E') {
      warnstr[1] = 'g';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
    }
    break;
  case 'Y':
    if (name[1] == 'B') {
      warnstr[1] = 'i';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
    }
    break;
  case 'Z':
    if (name[1] == 'N') {
      warnstr[1] = 'j';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
    }
    else if (name[1] == 'R') {
      warnstr[1] = 'k';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
    }
  }
  if ((int)warnstr._1_4_ < 0) {
    stack0xffffffffffffffdc = 1;
    warnstr[1] = '\x06';
    warnstr[2] = '\0';
    warnstr[3] = '\0';
    warnstr[4] = '\0';
    switch(name[1]) {
    case 'A':
      switch(name[2]) {
      case 'G':
        warnstr[1] = '\x0e';
        warnstr[2] = '\0';
        warnstr[3] = '\0';
        warnstr[4] = '\0';
        break;
      case 'L':
        warnstr[1] = '\x0f';
        warnstr[2] = '\0';
        warnstr[3] = '\0';
        warnstr[4] = '\0';
        break;
      case 'S':
        warnstr[1] = '\x12';
        warnstr[2] = '\0';
        warnstr[3] = '\0';
        warnstr[4] = '\0';
        break;
      case 'U':
        warnstr[1] = '\x14';
        warnstr[2] = '\0';
        warnstr[3] = '\0';
        warnstr[4] = '\0';
      }
      break;
    default:
      warnstr[1] = '\x06';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      break;
    case 'C':
      warnstr[1] = '\x06';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      break;
    case 'D':
    case 'H':
      warnstr[1] = '\x02';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      break;
    case 'F':
      if (name[2] == 'E') {
        warnstr[1] = ')';
        warnstr[2] = '\0';
        warnstr[3] = '\0';
        warnstr[4] = '\0';
      }
      break;
    case 'G':
      if (name[2] == 'D') {
        warnstr[1] = '-';
        warnstr[2] = '\0';
        warnstr[3] = '\0';
        warnstr[4] = '\0';
      }
      break;
    case 'I':
      warnstr[1] = '3';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      break;
    case 'K':
      warnstr[1] = '6';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      break;
    case 'L':
      if (name[2] == 'I') {
        warnstr[1] = '9';
        warnstr[2] = '\0';
        warnstr[3] = '\0';
        warnstr[4] = '\0';
      }
      break;
    case 'M':
      cVar1 = name[2];
      if (cVar1 == 'G') {
        warnstr[1] = '<';
        warnstr[2] = '\0';
        warnstr[3] = '\0';
        warnstr[4] = '\0';
      }
      else if (cVar1 == 'N') {
        warnstr[1] = '=';
        warnstr[2] = '\0';
        warnstr[3] = '\0';
        warnstr[4] = '\0';
      }
      else if (cVar1 == 'O') {
        warnstr[1] = '>';
        warnstr[2] = '\0';
        warnstr[3] = '\0';
        warnstr[4] = '\0';
      }
      break;
    case 'N':
      warnstr[1] = '\b';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      break;
    case 'O':
      warnstr[1] = '\t';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      break;
    case 'P':
      warnstr[1] = '\f';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      break;
    case 'S':
      warnstr[1] = '\v';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      break;
    case 'U':
      warnstr[1] = 'd';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      break;
    case 'V':
      warnstr[1] = 'e';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      break;
    case 'W':
      warnstr[1] = 'f';
      warnstr[2] = '\0';
      warnstr[3] = '\0';
      warnstr[4] = '\0';
      break;
    case 'Z':
      if (name[2] == 'N') {
        warnstr[1] = 'j';
        warnstr[2] = '\0';
        warnstr[3] = '\0';
        warnstr[4] = '\0';
      }
    }
  }
  if ((stack0xffffffffffffffdc != 0) && (Verbose != 0)) {
    stack0xffffffffffffffd7 = 0x5f5f5f5f;
    warnresn[1] = '\0';
    atstr._2_4_ = 0x5f5f5f5f;
    atstr._6_1_ = 0;
    local_3c = 0;
    while( true ) {
      bVar4 = false;
      if (name[local_3c] != '\0') {
        bVar4 = *(char *)((long)&atstr + (long)local_3c + 7) != '\0';
      }
      if (!bVar4) break;
      if (name[local_3c] == ' ') {
        *(undefined1 *)((long)&atstr + (long)local_3c + 7) = 0x5f;
      }
      else {
        *(char *)((long)&atstr + (long)local_3c + 7) = name[local_3c];
      }
      local_3c = local_3c + 1;
    }
    local_3c = 0;
    while( true ) {
      bVar4 = false;
      if (resname[local_3c] != '\0') {
        bVar4 = *(char *)((long)&atstr + (long)local_3c + 2) != '\0';
      }
      if (!bVar4) break;
      if (name[local_3c] == ' ') {
        *(undefined1 *)((long)&atstr + (long)local_3c + 2) = 0x5f;
      }
      else {
        *(char *)((long)&atstr + (long)local_3c + 2) = resname[local_3c];
      }
      local_3c = local_3c + 1;
    }
    __s = getAtomName(warnstr._1_4_);
    sVar3 = strlen(__s);
    if (sVar3 == 1) {
      fprintf(_stderr,"WARNING: atom %s from resn %s will be treated as  %s\n",(long)&atstr + 7,
              (long)&atstr + 2,__s);
    }
    else {
      fprintf(_stderr,"WARNING: atom %s from resn %s will be treated as %s\n",(long)&atstr + 7,
              (long)&atstr + 2,__s);
    }
  }
  iVar2._0_1_ = warnstr[1];
  iVar2._1_1_ = warnstr[2];
  iVar2._2_1_ = warnstr[3];
  iVar2._3_1_ = warnstr[4];
  return iVar2;
}

Assistant:

int identifyAtom(char* name, char resname[], int Verbose) {  /*dcr041007 allow warning choice*/
   int n = -1, emitWarning = 0;

   switch(name[0]) {
   case '*': case '\'': case '"': case '`': case '_':
   case '+': case '-':  case ' ':
   case '0': case '1': case '2': case '3': case '4':
   case '5': case '6': case '7': case '8': case '9':
      switch(name[1]) {
      case 'A':
	 switch(name[3]) {
	 case '1': n = atomO; emitWarning = 1; break;
	 case '2': n = atomN; emitWarning = 1; break;
	 } break;
      case 'B': n = atomB; break;
      case 'C': n = atomC; break;
      case 'D': n = atomH; break;
      case 'F': n = atomF; break;
      case 'H':
        switch(name[2]) {
        case 'E': n = fixAtomName(name,resname,2) ? atomHe : atomH; break;
        case 'F': n = fixAtomName(name,resname,2) ? atomHf : atomH; break;
        case 'G': n = fixAtomName(name,resname,2) ? atomHg : atomH; break;
        case 'O': n = fixAtomName(name,resname,2) ? atomHo : atomH; break;
/*        case 'S': n = fixAtomName(name,resname,2) ? atomHs : atomH; break; */
        default : n = atomH; break;
        } break;
      case 'I': n = atomI; break;
      case 'K': n = atomK; break;
      case 'N': n = atomN; break;
      case 'O': n = atomO; break;
      case 'P': n = atomP; break;
    /*case 'S': n = atomS; break;*/
      case 'S':
         if(name[0] == ' ' && name[2] == 'E')
         {/*_SE likely refmac,cns missplaced Selenium atom name dcr041007*/
                n = atomSe; emitWarning = 1; break;
         }
         else  {n = atomS; break;} /*050121 NO warning for other S*/
      case 'U': n = atomU; break;
      case 'V': n = atomV; break;
      case 'W': n = atomW; break;
      case 'Y': n = atomY; break;
      } break;
   case 'A':
      switch(name[1]) {
      case 'C': n = atomC;  emitWarning = 1;break;/*nonstd!*/
      case 'G': n = atomAg; break;
      case 'H': n = atomH;  emitWarning = 1;break;
      case 'L': n = atomAl; break;
      case 'M': n = atomAm; break;
      case 'N': n = atomN;  emitWarning = 1;break;
      case 'O': n = atomO;  emitWarning = 1;break;
      case 'P': n = atomP;  emitWarning = 1;break;
      case 'R': n = atomAr; break;
      case 'S': n = atomAs; break;
      case 'T': n = atomAt; break;
      case 'U': n = atomAu; break;
      } break;
   case 'B':
      switch(name[1]) {
      case 'A': n = atomBa; break;
      case 'E': n = atomBe; break;
      case 'I': n = atomBi; break;
      case 'K': n = atomBk; break;
      case 'R': n = atomBr; break;
      } break;
   case 'C':
      switch(name[1]) {
      case 'A': n = atomCa; break;
      case 'C': n = atomC;  emitWarning = 1;break;
      case 'D': n = atomCd; break;
      case 'E': n = atomCe; break;
      case 'F': n = atomCf; break;
      case 'H': n = atomH;  emitWarning = 1;break;
      case 'L': n = atomCl; break;
      case 'M': n = atomCm; break;
      case 'N': n = atomN;  emitWarning = 1;break;
      case 'O': n = atomCo; emitWarning = 1;break;
      case 'P': n = atomP;  emitWarning = 1;break;
      case 'R': n = atomCr; break;
      case 'S': n = atomCs; break;
      case 'U': n = atomCu; break;
      default:  n = atomC;  emitWarning = 1;break;
      } break;
   case 'D':
      switch(name[1]) {
      case 'Y': n = atomDy; break;
      case 'C': n = atomC;  emitWarning = 1;break;
      case 'H': n = atomH;  emitWarning = 1;break;
      case 'N': n = atomN;  emitWarning = 1;break;
      case 'O': n = atomO;  emitWarning = 1;break;
      case 'P': n = atomP;  emitWarning = 1;break;
      default:  n = atomH;  emitWarning = 1;break;
      } break;
   case 'E':
      switch(name[1]) {
      case 'R': n = atomEr; break;
      case 'S': n = atomEs; break;
      case 'U': n = atomEu; break;
      case 'C': n = atomC;  emitWarning = 1;break;
      case 'H': n = atomH;  emitWarning = 1;break;
      case 'N': n = atomN;  emitWarning = 1;break;
      case 'O': n = atomO;  emitWarning = 1;break;
      case 'P': n = atomP;  emitWarning = 1;break;
      } break;
   case 'F':
      switch(name[1]) {
      case 'E': n = atomFe; break;
      case 'M': n = atomFm; break;
      case 'R': n = atomFr; break;
      case 'C': n = atomC;  emitWarning = 1;break;
      case 'H': n = atomH;  emitWarning = 1;break;
      case 'N': n = atomN;  emitWarning = 1;break;
      case 'O': n = atomO;  emitWarning = 1;break;
      case 'P': n = atomP;  emitWarning = 1;break;
      } break;
   case 'G':
      switch(name[1]) {
      case 'A': n = atomGa; break;
      case 'D': n = atomGd; break;
      case 'E': n = atomGe; break;
      case 'C': n = atomC;  emitWarning = 1;break;
      case 'H': n = atomH;  emitWarning = 1;break;
      case 'N': n = atomN;  emitWarning = 1;break;
      case 'O': n = atomO;  emitWarning = 1;break;
      case 'P': n = atomP;  emitWarning = 1;break;
      } break;
   case 'H':
      switch(name[1]) {
      case 'E': n = fixAtomName(name,resname,1) ? atomHe : atomH; break;
      case 'F': n = fixAtomName(name,resname,1) ? atomHf : atomH; break;
      case 'G': n = fixAtomName(name,resname,1) ? atomHg : atomH; break;
      case 'O': n = fixAtomName(name,resname,1) ? atomHo : atomH; break;
/*      case 'S': n = fixAtomName(name,resname,1) ? atomHs : atomH; break; */
      default : n = atomH; break;
      } break;

/*    case 'E': */
/*  if (isdigit(name[2])) { n = atomH; emitWarning = 1;} */ /* Hepsilon?? */
/*  else {n = atomHe; emitWarning = 1;} */
/*  break; */
/*      case 'F': n = atomHf; emitWarning = 1;break; */
/*      case 'G': */
/*  if (isdigit(name[2])) { n = atomH; emitWarning = 1;} */ /* Hgamma?? */
/*  else {n = atomHg; emitWarning = 1;} */
/*  break; */
/*      case 'O': n = atomHo; emitWarning = 1;break; */
/*      default:  n = atomH;  emitWarning = 1;break; */
/*      } break; */

   case 'I':
      switch(name[1]) {
      case 'N': n = atomIn; break;
      case 'R': n = atomIr; break;
      } break;
   case 'K':
      if (name[1] == 'R') n = atomKr; break;
   case 'L':
      switch(name[1]) {
      case 'A': n = atomLa; break;
      case 'I': n = atomLi; break;
      case 'U': n = atomLu; break;
      } break;
   case 'M':
      switch(name[1]) {
      case 'D': n = atomMd; break;
      case 'G': n = atomMg; break;
      case 'N': n = atomMn; break;
      case 'O': n = atomMo; break;
      } break;
   case 'N':
      switch(name[1]) {
      case 'A': n = atomNa; emitWarning = 1;break;
      case 'B': n = atomNb; emitWarning = 1;break;
      case 'C': n = atomC;  emitWarning = 1;break;
      case 'D': n = atomNd; emitWarning = 1;break;
      case 'E': n = atomNe; emitWarning = 1;break;
      case 'H': n = atomH;  emitWarning = 1;break;
      case 'I': n = atomNi; break;
      case 'N': n = atomN;  emitWarning = 1;break;
      case 'O': n = atomO;  emitWarning = 1;break;/*nonstd!*/
      case 'P': n = atomP;  emitWarning = 1;break;/*nonstd!*/
      case 'S': n = atomS;  emitWarning = 1;break;
      default:  n = atomN;  emitWarning = 1;break;
      } break;
   case 'O':
      switch(name[1]) {
      case 'S': n = atomOs; break;
      default:  n = atomO;  emitWarning = 1;break;
      } break;
   case 'P':
      switch(name[1]) {
      case 'A': n = atomPa; emitWarning = 1;break;
      case 'B': n = atomPb; emitWarning = 1;break;
      case 'D': n = atomPd; emitWarning = 1;break;
      case 'M': n = atomPm; break;
      case 'O': n = atomPo; break;
      case 'R': n = atomPr; break;
      case 'T': n = atomPt; break;
      case 'U': n = atomPu; break;
      default:  n = atomP;  emitWarning = 1;break;
      } break;
   case 'R':
      switch(name[1]) {
      case 'A': n = atomRa; break;
      case 'B': n = atomRb; break;
      case 'E': n = atomRe; break;
      case 'H': n = atomRh; break;
      case 'N': n = atomRn; break;
      case 'U': n = atomRu; break;
      } break;
   case 'S':
      switch(name[1]) {
      case 'B': n = atomSb; emitWarning = 1;break;
      case 'C': n = atomSc; break;
      case 'E': n = atomSe; emitWarning = 1;break;
      case 'I': n = atomSi; break;
      case 'M': n = atomSm; break;
      case 'N': n = atomSn; break;
      case 'R': n = atomSr; break;
      default:  n = atomS;  emitWarning = 1;break;
      } break;
   case 'T':
      switch(name[1]) {
      case 'A': n = atomTa; break;
      case 'B': n = atomTb; break;
      case 'C': n = atomTc; break;
      case 'E': n = atomTe; break;
      case 'H': n = atomTh; break;
      case 'I': n = atomTi; break;
      case 'L': n = atomTl; break;
      case 'M': n = atomTm; break;
      } break;
   case 'X':
      if (name[1] == 'E') n = atomXe; break;
   case 'Y':
      if (name[1] == 'B') n = atomYb; break;
   case 'Z':
      switch(name[1]) {
      case 'N': n = atomZn; break;
      case 'R': n = atomZr; break;
      } break;
   default: break;
   }

   if (n < 0) { emitWarning = 1;
      n = atomC;

      switch(name[1]) {
      case 'H': case 'D': n = atomH; break;
      case 'C': n = atomC; break;
      case 'N': n = atomN; break;
      case 'O': n = atomO; break;
      case 'P': n = atomP; break;
      case 'S': n = atomS; break;

      case 'I': n = atomI; break;
      case 'K': n = atomK; break;
      case 'V': n = atomV; break;
      case 'W': n = atomW; break;
      case 'U': n = atomU; break;

      case 'A':
	 switch(name[2]) {
	 case 'G': n = atomAg; break;
	 case 'L': n = atomAl; break;
	 case 'S': n = atomAs; break;
	 case 'U': n = atomAu; break;
	 } break;
      case 'F':
	 if (name[2] == 'E') n = atomFe; break;
      case 'G':
	 if (name[2] == 'D') n = atomGd; break;
      case 'L':
	 if (name[2] == 'I') n = atomLi; break;
      case 'M':
	 switch(name[2]) {
	 case 'G': n = atomMg; break;
	 case 'N': n = atomMn; break;
	 case 'O': n = atomMo; break;
	 } break;
      case 'Z':
	 if (name[2] == 'N') n = atomZn; break;
/* --------- default if we fall through... ---------------------*/
      default: n = atomC; break;
      }
   }
   if (emitWarning && Verbose) {/*Verbose controlled dcr041007*/
      char warnstr[5]={'_','_','_','_','\0'}; /*dcr041007*/
      char warnresn[5]={'_','_','_','_','\0'}; /*rmi070719*/
      char* atstr;
      int j=0;
      while(name[j]!='\0'&&warnstr[j]!='\0')
      {/*explicitly show blanks so can understand atom name problem*/
         if(name[j]==' ') {warnstr[j]='_';}
         else             {warnstr[j]=name[j];}
         j++;
      }
      j=0;
      while(resname[j]!='\0'&&warnresn[j]!='\0')
      {/*explicitly show blanks so can understand residue/atom name problem*/
         if(name[j]==' ') {warnresn[j]='_';}
         else             {warnresn[j]=resname[j];}
         j++;
      }
      atstr = getAtomName(n);
      if(strlen(atstr)==1)
           {fprintf(stderr,"WARNING: atom %s from resn %s will be treated as  %s\n",warnstr,warnresn,atstr);}
      else {fprintf(stderr,"WARNING: atom %s from resn %s will be treated as %s\n",warnstr,warnresn,atstr);}
         /*name, getAtomName(n));*/
   }

   return n;
}